

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfile.cpp
# Opt level: O0

int __thiscall QFile::remove(QFile *this,char *__filename)

{
  bool bVar1;
  FileError FVar2;
  int iVar3;
  QFilePrivate *pQVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar5;
  long in_FS_OFFSET;
  QFilePrivate *d;
  undefined4 in_stack_ffffffffffffff68;
  FileError in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  QMessageLogger *in_stack_ffffffffffffff80;
  undefined1 local_41;
  QMessageLogger local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func((QFile *)0x2a3040);
  bVar1 = QString::isEmpty((QString *)0x2a3056);
  if (bVar1) {
    iVar3 = (*(pQVar4->super_QFileDevicePrivate).super_QIODevicePrivate.super_QObjectPrivate.
              super_QObjectData._vptr_QObjectData[7])();
    uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x140))();
    if ((uVar5 & 1) == 0) {
      QMessageLogger::QMessageLogger
                (in_stack_ffffffffffffff80,
                 (char *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                 in_stack_ffffffffffffff74,
                 (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      QMessageLogger::warning(&local_28,"QFile::remove: Empty or null file name");
      local_41 = 0;
      goto LAB_002a3167;
    }
  }
  QFileDevice::unsetError
            ((QFileDevice *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  (*(this->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0xe])();
  FVar2 = QFileDevice::error((QFileDevice *)
                             CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  if (FVar2 == NoError) {
    iVar3 = (*(pQVar4->super_QFileDevicePrivate).super_QIODevicePrivate.super_QObjectPrivate.
              super_QObjectData._vptr_QObjectData[7])();
    uVar5 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar3) + 0x50))();
    if ((uVar5 & 1) != 0) {
      QFileDevice::unsetError
                ((QFileDevice *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
      local_41 = 1;
      goto LAB_002a3167;
    }
    std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::operator->
              ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
               0x2a3110);
    QAbstractFileEngine::errorString
              ((QAbstractFileEngine *)CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78))
    ;
    QFileDevicePrivate::setError
              ((QFileDevicePrivate *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff6c,(QString *)0x2a3136);
    QString::~QString((QString *)0x2a3142);
  }
  local_41 = 0;
LAB_002a3167:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (int)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),local_41);
}

Assistant:

bool
QFile::remove()
{
    Q_D(QFile);
    if (d->fileName.isEmpty() &&
            !static_cast<QFSFileEngine *>(d->engine())->isUnnamedFile()) {
        qWarning("QFile::remove: Empty or null file name");
        return false;
    }
    unsetError();
    close();
    if (error() == QFile::NoError) {
        if (d->engine()->remove()) {
            unsetError();
            return true;
        }
        d->setError(QFile::RemoveError, d->fileEngine->errorString());
    }
    return false;
}